

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kseq.hpp
# Opt level: O3

int __thiscall
kstream<gzFile_s_*,_FunctorZlib>::getc(kstream<gzFile_s_*,_FunctorZlib> *this,FILE *__stream)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  
  iVar2 = this->begin;
  iVar3 = -1;
  if (iVar2 < this->end || this->is_eof == 0) {
    if (this->end <= iVar2) {
      this->begin = 0;
      uVar1 = gzread(this->f,this->buf,this->bufferSize);
      this->end = uVar1;
      if (uVar1 < this->bufferSize) {
        this->is_eof = 1;
      }
      if (uVar1 == 0) {
        return -1;
      }
      iVar2 = this->begin;
    }
    this->begin = iVar2 + 1;
    iVar3 = (int)this->buf[iVar2];
  }
  return iVar3;
}

Assistant:

int getc()
    {
        if (this->is_eof && this->begin >= this->end)
            return -1;
        if (this->begin >= this->end)
        {
            this->begin = 0;
            this->end = this->readfunc(this->f, this->buf, bufferSize);
            if (this->end < bufferSize)
                this->is_eof = 1;
            if (this->end == 0)
                return -1;
        }
        return (int)this->buf[this->begin++];
    }